

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeSplitLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  LogMessage *pLVar1;
  mapped_type *this_00;
  LayerUnion LVar2;
  Type *pTVar3;
  mapped_type *pmVar4;
  ShapeRange *pSVar5;
  int val;
  int index;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_01;
  LogMessage local_c0;
  ShapeRange local_88;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_01 = &this->blobShapes;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_01,(key_type *)
                                 ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  if (specLayer->_oneof_case_[0] == 0x14a) {
    LVar2 = specLayer->layer_;
  }
  else {
    LVar2.split_ = Specification::SplitLayerParams::default_instance();
  }
  val = SUB84((LVar2.activation_)->NonlinearityType_,0);
  if (0 < (specLayer->output_).super_RepeatedPtrFieldBase.current_size_) {
    index = 0;
    do {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(specLayer->output_).super_RepeatedPtrFieldBase,index);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](this_01,pTVar3);
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(specLayer->output_).super_RepeatedPtrFieldBase,index);
      ShapeConstraint::setName(pmVar4,pTVar3);
      pSVar5 = ShapeConstraint::sequenceRange(this_00);
      ShapeConstraint::updateSequenceRange(pmVar4,pSVar5);
      pSVar5 = ShapeConstraint::batchRange(this_00);
      ShapeConstraint::updateBatchRange(pmVar4,pSVar5);
      pSVar5 = ShapeConstraint::channelRange(this_00);
      ShapeRange::operator/((ShapeRange *)&local_c0,pSVar5,val);
      ShapeConstraint::updateChannelRange(pmVar4,(ShapeRange *)&local_c0);
      pSVar5 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange(pmVar4,pSVar5);
      pSVar5 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange(pmVar4,pSVar5);
      index = index + 1;
    } while (index < (specLayer->output_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,(key_type *)
                                ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  pSVar5 = ShapeConstraint::sequenceRange(pmVar4);
  ShapeConstraint::updateSequenceRange(this_00,pSVar5);
  pSVar5 = ShapeConstraint::batchRange(pmVar4);
  ShapeConstraint::updateBatchRange(this_00,pSVar5);
  pSVar5 = ShapeConstraint::channelRange(pmVar4);
  ShapeRange::operator*(&local_88,pSVar5,(long)val);
  ShapeConstraint::updateChannelRange(this_00,&local_88);
  pSVar5 = ShapeConstraint::heightRange(pmVar4);
  ShapeConstraint::updateHeightRange(this_00,pSVar5);
  pSVar5 = ShapeConstraint::widthRange(pmVar4);
  ShapeConstraint::updateWidthRange(this_00,pSVar5);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSplitLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Split layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Split layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));
        std::cout << outputShape;
    }
#endif

    int nout = static_cast<int>(specLayer.split().noutputs());

    for (int i = 0; i < specLayer.output_size(); i++) {

        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));

        outputShape.updateSequenceRange(inputShape.sequenceRange());
        outputShape.updateBatchRange(inputShape.batchRange());
        outputShape.updateChannelRange(inputShape.channelRange() / nout);
        outputShape.updateHeightRange(inputShape.heightRange());
        outputShape.updateWidthRange(inputShape.widthRange());

    }
    
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange() * static_cast<size_t>(nout));
    inputShape.updateHeightRange(outputShape.heightRange());
    inputShape.updateWidthRange(outputShape.widthRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Split layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Split layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));
        std::cout << outputShape;
    }
#endif


}